

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_tobin.c
# Opt level: O0

int cfg_tobin_strarray(void *reference,size_t bin_size,const_strarray *value,size_t array_size)

{
  char *ptr;
  size_t array_size_local;
  const_strarray *value_local;
  size_t bin_size_local;
  void *reference_local;
  
  if (bin_size < array_size) {
    reference_local._4_4_ = -1;
  }
  else {
    strscpy((char *)reference,value->value,array_size);
    reference_local._4_4_ = 0;
  }
  return reference_local._4_4_;
}

Assistant:

int
cfg_tobin_strarray(void *reference, size_t bin_size, const struct const_strarray *value, size_t array_size) {
  char *ptr;

  if (bin_size < array_size) {
    return -1;
  }

  ptr = (char *)reference;

  strscpy(ptr, strarray_get_first_c(value), array_size);
  return 0;
}